

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::BuildResult(Clipper *this,Polygons *polys)

{
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *this_00;
  pointer ppOVar1;
  pointer pvVar2;
  pointer pIVar3;
  pointer pIVar4;
  int iVar5;
  size_type __new_size;
  size_type i;
  ulong uVar6;
  OutPt *pOVar7;
  
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::resize(polys,(long)(this->m_PolyOuts).
                       super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_PolyOuts).
                       super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
  uVar6 = 0;
  iVar5 = 0;
  while( true ) {
    ppOVar1 = (this->m_PolyOuts).
              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    __new_size = (size_type)iVar5;
    if ((ulong)((long)(this->m_PolyOuts).
                      super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar1 >> 3) <= uVar6)
    break;
    pOVar7 = ppOVar1[uVar6]->pts;
    if (pOVar7 != (OutPt *)0x0) {
      pvVar2 = (polys->
               super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      this_00 = pvVar2 + __new_size;
      pIVar3 = pvVar2[__new_size].
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar2[__new_size].
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data + 8) != pIVar3) {
        (this_00->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
        _M_impl.super__Vector_impl_data._M_finish = pIVar3;
        pOVar7 = (this->m_PolyOuts).
                 super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar6]->pts;
      }
      do {
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                  (this_00,&pOVar7->pt);
        pOVar7 = pOVar7->next;
      } while (pOVar7 != (this->m_PolyOuts).
                         super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar6]->pts);
      pIVar3 = (this_00->
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pIVar4 = (this_00->
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)((long)pIVar4 - (long)pIVar3) < 0x21) {
        if (pIVar4 != pIVar3) {
          (this_00->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>)
          ._M_impl.super__Vector_impl_data._M_finish = pIVar3;
        }
      }
      else {
        iVar5 = iVar5 + 1;
      }
    }
    uVar6 = uVar6 + 1;
  }
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::resize(polys,__new_size);
  return;
}

Assistant:

void Clipper::BuildResult(Polygons &polys)
{
  int k = 0;
  polys.resize(m_PolyOuts.size());
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    if (m_PolyOuts[i]->pts)
    {
      Polygon* pg = &polys[k];
      pg->clear();
      OutPt* p = m_PolyOuts[i]->pts;
      do
      {
        pg->push_back(p->pt);
        p = p->next;
      } while (p != m_PolyOuts[i]->pts);
      //make sure each polygon has at least 3 vertices ...
      if (pg->size() < 3) pg->clear(); else k++;
    }
  }
  polys.resize(k);
}